

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::iu_to_string<int>(string *__return_storage_ptr__,int *value)

{
  to_chars_result tVar1;
  allocator<char> local_b9;
  char *local_b8;
  to_chars_result r;
  char buf [128];
  size_t kN;
  int *value_local;
  
  buf[0x68] = '\0';
  buf[0x69] = '\0';
  buf[0x6a] = '\0';
  buf[0x6b] = '\0';
  buf[0x6c] = '\0';
  buf[0x6d] = '\0';
  buf[0x6e] = '\0';
  buf[0x6f] = '\0';
  buf[0x70] = '\0';
  buf[0x71] = '\0';
  buf[0x72] = '\0';
  buf[0x73] = '\0';
  buf[0x74] = '\0';
  buf[0x75] = '\0';
  buf[0x76] = '\0';
  buf[0x77] = '\0';
  buf[0x58] = '\0';
  buf[0x59] = '\0';
  buf[0x5a] = '\0';
  buf[0x5b] = '\0';
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  buf[0x60] = '\0';
  buf[0x61] = '\0';
  buf[0x62] = '\0';
  buf[99] = '\0';
  buf[100] = '\0';
  buf[0x65] = '\0';
  buf[0x66] = '\0';
  buf[0x67] = '\0';
  buf[0x48] = '\0';
  buf[0x49] = '\0';
  buf[0x4a] = '\0';
  buf[0x4b] = '\0';
  buf[0x4c] = '\0';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  buf[0x50] = '\0';
  buf[0x51] = '\0';
  buf[0x52] = '\0';
  buf[0x53] = '\0';
  buf[0x54] = '\0';
  buf[0x55] = '\0';
  buf[0x56] = '\0';
  buf[0x57] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x40] = '\0';
  buf[0x41] = '\0';
  buf[0x42] = '\0';
  buf[0x43] = '\0';
  buf[0x44] = '\0';
  buf[0x45] = '\0';
  buf[0x46] = '\0';
  buf[0x47] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  r.ec = 0;
  r._12_4_ = 0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  tVar1 = std::to_chars((char *)&r.ec,buf + 0x78,*value,10);
  local_b8 = tVar1.ptr;
  r.ptr._0_4_ = tVar1.ec;
  *local_b8 = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&r.ec,&local_b9);
  std::allocator<char>::~allocator(&local_b9);
  return __return_storage_ptr__;
}

Assistant:

::std::string iu_to_string(const T& value)
{
    const size_t kN = 128;
    char buf[kN] = { 0 };
    const ::std::to_chars_result r = ::std::to_chars(buf, buf + kN, value);
    *r.ptr = '\0';
    return buf;
}